

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O1

void __thiscall
duckdb::MultiFileReader::GetPartitionData
          (MultiFileReader *this,ClientContext *context,MultiFileReaderBindData *bind_data,
          MultiFileReaderData *reader_data,
          optional_ptr<duckdb::MultiFileReaderGlobalState,_true> global_state,
          OperatorPartitionInfo *partition_info,OperatorPartitionData *partition_data)

{
  idx_t *piVar1;
  pointer pMVar2;
  pointer pMVar3;
  bool bVar4;
  InternalException *this_00;
  pointer pMVar5;
  idx_t *piVar6;
  string local_50;
  
  piVar6 = (partition_info->partition_columns).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (partition_info->partition_columns).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar6 != piVar1) {
    do {
      pMVar2 = (reader_data->constant_map).constant_map.
               super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
               .
               super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar3 = (reader_data->constant_map).constant_map.
               super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
               .
               super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pMVar2 == pMVar3) {
LAB_00ac95ed:
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "MultiFileReader::GetPartitionData - did not find constant for the given partition"
                   ,"");
        InternalException::InternalException(this_00,&local_50);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar4 = false;
      do {
        pMVar5 = pMVar2 + 1;
        if ((pMVar2->column_idx).index == *piVar6) {
          ::std::vector<duckdb::ColumnPartitionData,std::allocator<duckdb::ColumnPartitionData>>::
          emplace_back<duckdb::Value_const&>
                    ((vector<duckdb::ColumnPartitionData,std::allocator<duckdb::ColumnPartitionData>>
                      *)&partition_data->partition_data,&pMVar2->value);
          bVar4 = true;
          break;
        }
        pMVar2 = pMVar5;
      } while (pMVar5 != pMVar3);
      if (!bVar4) goto LAB_00ac95ed;
      piVar6 = piVar6 + 1;
    } while (piVar6 != piVar1);
  }
  return;
}

Assistant:

void MultiFileReader::GetPartitionData(ClientContext &context, const MultiFileReaderBindData &bind_data,
                                       const MultiFileReaderData &reader_data,
                                       optional_ptr<MultiFileReaderGlobalState> global_state,
                                       const OperatorPartitionInfo &partition_info,
                                       OperatorPartitionData &partition_data) {
	for (idx_t col : partition_info.partition_columns) {
		bool found_constant = false;
		for (auto &constant : reader_data.constant_map) {
			if (constant.column_idx.GetIndex() == col) {
				found_constant = true;
				partition_data.partition_data.emplace_back(constant.value);
				break;
			}
		}
		if (!found_constant) {
			throw InternalException(
			    "MultiFileReader::GetPartitionData - did not find constant for the given partition");
		}
	}
}